

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamedLocationIdentifier.h
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::SeparationPart::SetStationLocation
          (SeparationPart *this,NamedLocationIdentifier *SL)

{
  KUINT16 KVar1;
  
  KVar1 = SL->m_ui16StnNum;
  (this->m_StationLoc).m_ui16StnName = SL->m_ui16StnName;
  (this->m_StationLoc).m_ui16StnNum = KVar1;
  return;
}

Assistant:

class KDIS_EXPORT NamedLocationIdentifier : public DataTypeBase
{
protected:

    KUINT16 m_ui16StnName;

    KUINT16 m_ui16StnNum;

public:

    static const KUINT16 NAMED_LOCATION_ID_SIZE = 4;

    NamedLocationIdentifier();

    NamedLocationIdentifier(KDataStream &stream) noexcept(false);

    NamedLocationIdentifier( KDIS::DATA_TYPE::ENUMS::StationName SN,  KUINT16 StationNumber );

    virtual ~NamedLocationIdentifier();

    //************************************
    // FullName:    KDIS::DATA_TYPE::NamedLocationIdentifier::SetStationName
    //              KDIS::DATA_TYPE::NamedLocationIdentifier::GetStationName
    // Description: Specifies the station name within the host at which the part entity
    //              is located. If the part entity is On Station, this field shall
    //              specify the representation of the part�s location data fields.
    // Parameter:   StationName SN
    //************************************
    void SetStationName( KDIS::DATA_TYPE::ENUMS::StationName SN );
    KDIS::DATA_TYPE::ENUMS::StationName GetStationName() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::NamedLocationIdentifier::SetStationNumber
    //              KDIS::DATA_TYPE::NamedLocationIdentifier::GetStationNumber
    // Description: Specifies the number of the particular wingstation, cargo hold etc, at
    //              which the part is attached.
    // Parameter:   KUINT16 SN
    //************************************
    void SetStationNumber( KUINT16 SN );
    KUINT16 GetStationNumber() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::NamedLocationIdentifier::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::NamedLocationIdentifier::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::NamedLocationIdentifier::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const NamedLocationIdentifier & Value ) const;
    KBOOL operator != ( const NamedLocationIdentifier & Value ) const;
}